

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  dir_tree_s *pdVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  dir_tree_t *trees;
  int *piVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int update;
  ulong uVar11;
  file_entry_t *pfVar12;
  byte *pbVar13;
  stat zipstat;
  stat local_b0;
  
  if (argc < 2) {
    bVar4 = false;
    uVar10 = 1;
    iVar8 = 1;
    update = 0;
  }
  else {
    iVar8 = 1;
    update = 0;
    uVar10 = 1;
    bVar4 = false;
    do {
      pbVar13 = (byte *)argv[uVar10];
      if (*pbVar13 == 0x2d) {
        if ((pbVar13[1] == 0x2d) && (pbVar13[2] == 0)) goto LAB_00104a24;
        while( true ) {
          while( true ) {
            while( true ) {
              pbVar13 = pbVar13 + 1;
              bVar1 = *pbVar13;
              if (bVar1 < 0x71) break;
              if (bVar1 == 0x71) {
                Quiet = 1;
              }
              else {
                if (bVar1 != 0x75) goto LAB_00104adb;
                update = 1;
              }
            }
            if (bVar1 != 100) break;
            DeflateOnly = 1;
          }
          if (bVar1 != 0x66) break;
          bVar4 = true;
        }
        if (bVar1 != 0) {
LAB_00104adb:
          main_cold_1();
          return 1;
        }
      }
      else {
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        argv[lVar6] = (char *)pbVar13;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)argc);
    uVar10 = (ulong)(uint)argc;
  }
LAB_00104a24:
  uVar9 = (uint)uVar10;
  if ((int)uVar9 <= argc) {
    uVar11 = uVar10 & 0xffffffff;
    lVar6 = 0;
    do {
      argv[iVar8 + lVar6] = argv[uVar11 + lVar6];
      iVar3 = (int)uVar10;
      uVar9 = iVar3 + 1;
      uVar10 = (ulong)uVar9;
      lVar6 = lVar6 + 1;
    } while (iVar3 < argc);
    iVar8 = iVar8 + (int)lVar6;
  }
  if ((int)((argc - uVar9) + iVar8) < 3) {
    main_cold_5();
  }
  else {
    trees = add_dirs(argv + 2);
    if (no_mem == '\x01') {
      main_cold_4();
    }
    else {
      iVar8 = stat(argv[1],&local_b0);
      if (iVar8 == 0) {
        bVar5 = true;
        if (!bVar4) {
          bVar5 = false;
          for (pdVar2 = trees; pdVar2 != (dir_tree_t *)0x0; pdVar2 = pdVar2->next) {
            pfVar12 = (file_entry_t *)&pdVar2->files;
            do {
              pfVar12 = pfVar12->next;
              if (pfVar12 == (file_entry_t *)0x0) goto LAB_00104ad1;
            } while (pfVar12->time_write <= local_b0.st_mtim.tv_sec);
            bVar5 = true;
LAB_00104ad1:
          }
        }
      }
      else {
        piVar7 = __errno_location();
        if (*piVar7 == 2) {
          update = 0;
          bVar5 = true;
        }
        else {
          main_cold_2();
          bVar5 = bVar4;
        }
      }
      if (bVar4 || bVar5) {
        write_zip(argv[1],trees,update);
      }
      while (trees != (dir_tree_t *)0x0) {
        pdVar2 = trees->next;
        free_dir_tree(trees);
        trees = pdVar2;
      }
      if (no_mem != '\x01') {
        return 0;
      }
      main_cold_3();
    }
  }
  return 1;
}

Assistant:

int main (int argc, char **argv)
{
	dir_tree_t *tree, *trees;
	file_entry_t *file;
	struct stat zipstat;
	int needwrite;
	int i, j, k;
	int force = 0;
	int update = 0;

	// Find options. Options are removed from the array.
	for (i = k = 1; i < argc; ++i)
	{
		if (argv[i][0] == '-')
		{
			if (argv[i][1] == '-')
			{
				if (argv[i][2] == '\0')
				{ // -- terminates option handling for the rest of the command line
					break;
				}
			}
			for (j = 1; argv[i][j] != '\0'; ++j)
			{
				if (argv[i][j] == 'f')
				{
					force = 1;
				}
				else if (argv[i][j] == 'd')
				{
					DeflateOnly = 1;
				}
				else if (argv[i][j] == 'u')
				{
					update = 1;
				}
				else if (argv[i][j] == 'q')
				{
					Quiet = 1;
				}
				else
				{
					fprintf(stderr, "Unknown option '%c'\n", argv[i][j]);
					print_usage(argv[0]);
					return 1;
				}
			}
		}
		else
		{
			argv[k++] = argv[i];
		}
	}
	for (; i <= argc; ++i)
	{
		argv[k++] = argv[i];
	}
	argc -= i - k;

	if (argc < 3)
	{
		print_usage(argv[0]);
		return 1;
	}

	trees = add_dirs(&argv[2]);
	if (no_mem)
	{
		free_dir_trees(trees);
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}

	needwrite = force;
	if (stat(argv[1], &zipstat) != 0)
	{
		if (errno == ENOENT)
		{
			needwrite = 1;
			update = 0;		// Can't update what's not there.
		}
		else
		{
			fprintf(stderr, "Could not stat %s: %s\n", argv[1], strerror(errno));
		}
	}
	else if (!needwrite)
	{
		// Check the files in each tree. If any one of them was modified more
		// recently than the zip, then it needs to be recreated.
		for (tree = trees; tree != NULL; tree = tree->next)
		{
			for (file = tree->files; file != NULL; file = file->next)
			{
				if (file->time_write > zipstat.st_mtime)
				{
					needwrite = 1;
					break;
				}
			}
		}
	}
	if (force || needwrite)
	{
		write_zip(argv[1], trees, update);
	}
	free_dir_trees(trees);
	if (no_mem)
	{
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}
	return 0;
}